

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierCopier.cpp
# Opt level: O1

void __thiscall
phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierCopier *this,IdentifierExpr *Node)

{
  string *Name;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer __s1;
  pointer piVar3;
  pointer __s2;
  pointer pcVar4;
  ExpressionNodeBuilder *this_00;
  AssignmentsListTy *pAVar5;
  int iVar6;
  IdentifierExpr *pIVar7;
  IdentifierExpr *pIVar8;
  _List_node_base *p_Var9;
  size_t __n;
  ExprDims *ED;
  bool bVar10;
  string Tmp;
  string local_70;
  string local_50;
  
  (*(Node->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_70);
  (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_50);
  bVar10 = true;
  if (local_70._M_string_length == local_50._M_string_length) {
    if (local_70._M_string_length == 0) {
      bVar10 = false;
    }
    else {
      iVar6 = bcmp(local_70._M_dataplus._M_p,local_50._M_dataplus._M_p,local_70._M_string_length);
      bVar10 = iVar6 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (!bVar10) {
    __s1 = (Node->super_ExpressionNode).Dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    piVar3 = (Node->super_ExpressionNode).Dims.super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    __n = (long)piVar3 - (long)__s1;
    __s2 = (this->CurrentLHS->super_ExpressionNode).Dims.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (__n != (long)(this->CurrentLHS->super_ExpressionNode).Dims.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)__s2) {
LAB_0013be53:
      __assert_fail("Node->getDims() == CurrentLHS->getDims()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/IdentifierCopier.cpp"
                    ,0x58,
                    "virtual void phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierExpr *)"
                   );
    }
    if (piVar3 != __s1) {
      iVar6 = bcmp(__s1,__s2,__n);
      if (iVar6 != 0) goto LAB_0013be53;
    }
    if (this->Incompatible == true) {
      ED = &(Node->super_ExpressionNode).Dims;
      Name = &this->ReplaceName;
      iVar6 = std::__cxx11::string::compare((char *)Name);
      if (iVar6 == 0) {
        CodeGen::getTmp_abi_cxx11_(&local_70,this->CG);
      }
      else {
        pcVar4 = (this->ReplaceName)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + (this->ReplaceName)._M_string_length);
      }
      pIVar7 = ExpressionNodeBuilder::createIdentifierExpr(this->CG->ExprNodeBuilder,&local_70,ED);
      if (this->Parent->NumChildren <= this->ChildIndex) {
        __assert_fail("I < getNumChildren()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/include/ph/Opt/TensorExprTree.h"
                      ,0x48,"void phaeton::ExpressionNode::setChild(int, ExpressionNode *)");
      }
      (this->Parent->Children).
      super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start[this->ChildIndex] = &pIVar7->super_ExpressionNode;
      iVar6 = std::__cxx11::string::compare((char *)Name);
      if (iVar6 == 0) {
        std::__cxx11::string::_M_assign((string *)Name);
        this_00 = this->CG->ExprNodeBuilder;
        (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_50);
        pIVar7 = ExpressionNodeBuilder::createIdentifierExpr
                           (this_00,&local_50,&(this->CurrentLHS->super_ExpressionNode).Dims);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pIVar8 = ExpressionNodeBuilder::createIdentifierExpr(this->CG->ExprNodeBuilder,Name,ED);
        pAVar5 = this->Assignments;
        p_Var9 = (_List_node_base *)operator_new(0x20);
        p_Var9[1]._M_next = (_List_node_base *)pIVar8;
        p_Var9[1]._M_prev = (_List_node_base *)pIVar7;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar1 = &(pAVar5->
                  super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void IdentifierCopier::transformIdentifierExpr(IdentifierExpr *Node) {
  // Note that current identifier should be different from 'LHS'.
  if (Node->getName() != CurrentLHS->getName()) {
    return;
  }

  // Note that identifiers with the same name must have the same type, here we
  // only check the dimension.
  assert(Node->getDims() == CurrentLHS->getDims());

  // If index structures of 'LHS' and the current identifier are compatible
  if (!Incompatible) {
    return;
  }

  // If we get here, that means current identifier must be replaced.
  // If there isn't a replacement for the identifier yet, we need to create a
  // name for it.
  const std::string Tmp = (ReplaceName != "") ? ReplaceName : getTmp();

  ExpressionNode *NewIdNode =
      getExprNodeBuilder()->createIdentifierExpr(Tmp, Node->getDims());
  Parent->setChild(ChildIndex, NewIdNode);

  // Note that if there wasn't a replacement identifier, we can simply assign
  // 'LHS' to it.
  if (ReplaceName == "") {
    ReplaceName = Tmp;
    ExpressionNode *CopyLHSId = getExprNodeBuilder()->createIdentifierExpr(
        CurrentLHS->getName(), CurrentLHS->getDims());
    ExpressionNode *NewRHSId = getExprNodeBuilder()->createIdentifierExpr(
        ReplaceName, Node->getDims());
    // Note: Replacement identifier for 'RHS' must be assigned the
    // value of 'LHS' before current assignment.
    // TODO: To make the insertion clear, we need to add a wrapper for
    // insertBefore and insertAfter.
    Assignments.insert(CurrentPos, {NewRHSId, CopyLHSId});
  }
}